

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O3

string * __thiscall
tinyusdz::Stage::ExportToString_abi_cxx11_
          (string *__return_storage_ptr__,Stage *this,bool relative_path)

{
  char *pcVar1;
  pointer pPVar2;
  long lVar3;
  string *psVar4;
  pointer pTVar5;
  iterator iVar6;
  pointer pTVar7;
  uint32_t in_ECX;
  pointer pTVar8;
  pointer pPVar9;
  ulong uVar10;
  long lVar11;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
  primNameTable;
  token nameTok;
  stringstream ss;
  stringstream meta_ss;
  undefined1 local_3b8 [32];
  _Base_ptr local_398;
  size_t local_390;
  string *local_388;
  key_type local_380;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base aiStack_138 [264];
  
  local_388 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_340);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_330,"#usda 1.0\n",10);
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  print_layer_metas_abi_cxx11_
            ((string *)local_3b8,(tinyusdz *)&this->stage_metas,(LayerMetas *)0x1,in_ECX);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_3b8._0_8_,CONCAT44(local_3b8._12_4_,local_3b8._8_4_));
  pcVar1 = local_3b8 + 0x10;
  if ((char *)local_3b8._0_8_ != pcVar1) {
    operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
  }
  ::std::__cxx11::stringbuf::str();
  lVar11 = CONCAT44(local_3b8._12_4_,local_3b8._8_4_);
  if ((char *)local_3b8._0_8_ != pcVar1) {
    operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
  }
  if (lVar11 != 0) {
    ::std::__ostream_insert<char,std::char_traits<char>>(local_330,"(\n",2);
    ::std::__cxx11::stringbuf::str();
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_330,(char *)local_3b8._0_8_,CONCAT44(local_3b8._12_4_,local_3b8._8_4_));
    if ((char *)local_3b8._0_8_ != pcVar1) {
      operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_330,")\n",2);
  }
  ::std::__ostream_insert<char,std::char_traits<char>>(local_330,"\n",1);
  pTVar8 = (this->stage_metas).primChildren.
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar5 = (this->stage_metas).primChildren.
           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar9 = (this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)pTVar8 - (long)pTVar5 >> 5 == ((long)pPVar2 - (long)pPVar9 >> 4) * 0x21cfb2b78c13521d) {
    local_3b8._24_8_ = local_3b8 + 8;
    local_3b8._8_4_ = _S_red;
    local_3b8._16_8_ = (_Link_type)0x0;
    local_390 = 0;
    local_398 = (_Base_ptr)local_3b8._24_8_;
    if (pPVar2 != pPVar9) {
      lVar11 = 0;
      uVar10 = 0;
      do {
        local_380._M_dataplus._M_p =
             (pointer)((long)&(pPVar9->_abs_path)._prim_part._M_dataplus._M_p + lVar11);
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::Prim_const*>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
                    *)local_3b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(pPVar9->_elementPath)._prim_part._M_dataplus._M_p + lVar11),
                   (Prim **)&local_380);
        uVar10 = uVar10 + 1;
        pPVar9 = (this->_root_nodes).
                 super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar11 = lVar11 + 0x350;
      } while (uVar10 < (ulong)(((long)(this->_root_nodes).
                                       super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar9 >>
                                4) * 0x21cfb2b78c13521d));
      pTVar5 = (this->stage_metas).primChildren.
               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
               super__Vector_impl_data._M_start;
      pTVar8 = (this->stage_metas).primChildren.
               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    if (pTVar8 != pTVar5) {
      lVar11 = 8;
      uVar10 = 0;
      do {
        lVar3 = *(long *)((long)pTVar5 + lVar11 + -8);
        local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_380,lVar3,
                   *(long *)((long)&(pTVar5->str_)._M_dataplus._M_p + lVar11) + lVar3);
        iVar6 = ::std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                        *)local_3b8,&local_380);
        if (iVar6._M_node != (_Base_ptr)(local_3b8 + 8)) {
          tinyusdz::prim::print_prim_abi_cxx11_
                    ((string *)&local_360,*(prim **)(iVar6._M_node + 2),(Prim *)0x0,
                     (uint32_t)(_Base_ptr)(local_3b8 + 8));
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (local_330,(char *)local_360._M_allocated_capacity,local_360._8_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_allocated_capacity != &local_350) {
            operator_delete((void *)local_360._M_allocated_capacity,
                            local_350._M_allocated_capacity + 1);
          }
          if (uVar10 != ((long)(this->stage_metas).primChildren.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->stage_metas).primChildren.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
            ::std::__ostream_insert<char,std::char_traits<char>>(local_330,"\n",1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_380._M_dataplus._M_p != &local_380.field_2) {
          operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
        }
        uVar10 = uVar10 + 1;
        pTVar5 = (this->stage_metas).primChildren.
                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar11 = lVar11 + 0x20;
      } while (uVar10 < (ulong)((long)(this->stage_metas).primChildren.
                                      super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >> 5
                               ));
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                *)local_3b8,(_Link_type)local_3b8._16_8_);
  }
  else if (pPVar2 != pPVar9) {
    lVar11 = 0;
    pTVar5 = (pointer)0x0;
    do {
      tinyusdz::prim::print_prim_abi_cxx11_
                ((string *)local_3b8,
                 (prim *)((long)&(pPVar9->_abs_path)._prim_part._M_dataplus._M_p + lVar11),
                 (Prim *)0x0,(uint32_t)pTVar8);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_330,(char *)local_3b8._0_8_,CONCAT44(local_3b8._12_4_,local_3b8._8_4_));
      if ((char *)local_3b8._0_8_ != pcVar1) {
        operator_delete((void *)local_3b8._0_8_,(ulong)(local_3b8._16_8_ + 1));
      }
      pPVar9 = (this->_root_nodes).
               super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
               super__Vector_impl_data._M_start;
      pTVar7 = (pointer)(((long)(this->_root_nodes).
                                super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pPVar9 >> 4) *
                        0x21cfb2b78c13521d);
      pTVar8 = (pointer)((long)&pTVar7[-1].str_.field_2._M_allocated_capacity + 0xf);
      if (pTVar5 != pTVar8) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_330,"\n",1);
        pPVar9 = (this->_root_nodes).
                 super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pTVar7 = (pointer)(((long)(this->_root_nodes).
                                  super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar9 >> 4) *
                          0x21cfb2b78c13521d);
      }
      pTVar5 = (pointer)((long)&(pTVar5->str_)._M_dataplus._M_p + 1);
      lVar11 = lVar11 + 0x350;
    } while (pTVar5 < pTVar7);
  }
  psVar4 = local_388;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(aiStack_138);
  ::std::__cxx11::stringstream::~stringstream(local_340);
  ::std::ios_base::~ios_base(aiStack_2c0);
  return psVar4;
}

Assistant:

std::string Stage::ExportToString(bool relative_path) const {
  (void)relative_path; // TODO

  std::stringstream ss;

  ss << "#usda 1.0\n";

  std::stringstream meta_ss;
  meta_ss << print_layer_metas(stage_metas, /* indent */1);
  if (meta_ss.str().size()) {
    ss << "(\n";
    ss << meta_ss.str();
    ss << ")\n";
  }

  ss << "\n";

  if (stage_metas.primChildren.size() == _root_nodes.size()) {
    std::map<std::string, const Prim *> primNameTable;
    for (size_t i = 0; i < _root_nodes.size(); i++) {
      primNameTable.emplace(_root_nodes[i].element_name(), &_root_nodes[i]);
    }

    for (size_t i = 0; i < stage_metas.primChildren.size(); i++) {
      value::token nameTok = stage_metas.primChildren[i];
      DCOUT(fmt::format("primChildren  {}/{} = {}", i,
                        stage_metas.primChildren.size(), nameTok.str()));
      const auto it = primNameTable.find(nameTok.str());
      if (it != primNameTable.end()) {
        //PrimPrintRec(ss, *(it->second), 0);
        ss << prim::print_prim(*(it->second), 0);
        if (i != (stage_metas.primChildren.size() - 1)) {
          ss << "\n";
        }
      } else {
        // TODO: Report warning?
      }
    }
  } else {
    for (size_t i = 0; i < _root_nodes.size(); i++) {
      //PrimPrintRec(ss, _root_nodes[i], 0);
      ss << prim::print_prim(_root_nodes[i], 0);

      if (i != (_root_nodes.size() - 1)) {
        ss << "\n";
      }
    }
  }

  return ss.str();
}